

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Section::~Section(Section *this)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pcVar3;
  int iVar4;
  long lVar5;
  IResultCapture *pIVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *local_90;
  SectionEndInfo endInfo;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_00236f68;
  if (this->m_sectionIncluded == true) {
    psVar1 = &endInfo.sectionInfo.name._M_string_length;
    pcVar3 = (this->m_info).name._M_dataplus._M_p;
    local_90 = psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (this->m_info).name._M_string_length);
    psVar2 = &endInfo.sectionInfo.description._M_string_length;
    pcVar3 = (this->m_info).description._M_dataplus._M_p;
    endInfo.sectionInfo.name.field_2._8_8_ = psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&endInfo.sectionInfo.name.field_2 + 8),pcVar3,
               pcVar3 + (this->m_info).description._M_string_length);
    endInfo.sectionInfo.description.field_2._8_8_ = (this->m_info).lineInfo.file;
    endInfo.sectionInfo.lineInfo.file = (char *)(this->m_info).lineInfo.line;
    endInfo.sectionInfo.lineInfo.line = (this->m_assertions).passed;
    endInfo.prevAssertions.passed = (this->m_assertions).failed;
    endInfo.prevAssertions.failed = (this->m_assertions).failedButOk;
    lVar5 = std::chrono::_V2::system_clock::now();
    endInfo.prevAssertions.failedButOk =
         (size_t)((double)((lVar5 - (this->m_timer).m_nanoseconds) / 1000) / 1000000.0);
    iVar4 = std::uncaught_exceptions();
    if (iVar4 < 1) {
      pIVar6 = getResultCapture();
      lVar5 = 0x18;
    }
    else {
      pIVar6 = getResultCapture();
      lVar5 = 0x20;
    }
    (**(code **)((long)pIVar6->_vptr_IResultCapture + lVar5))(pIVar6,&local_90);
    if ((size_type *)endInfo.sectionInfo.name.field_2._8_8_ != psVar2) {
      operator_delete((void *)endInfo.sectionInfo.name.field_2._8_8_,
                      endInfo.sectionInfo.description._M_string_length + 1);
    }
    if (local_90 != psVar1) {
      operator_delete(local_90,endInfo.sectionInfo.name._M_string_length + 1);
    }
  }
  pcVar3 = (this->m_name)._M_dataplus._M_p;
  paVar7 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar7) {
    operator_delete(pcVar3,paVar7->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_info).description._M_dataplus._M_p;
  paVar7 = &(this->m_info).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar7) {
    operator_delete(pcVar3,paVar7->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_info).name._M_dataplus._M_p;
  paVar7 = &(this->m_info).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar7) {
    operator_delete(pcVar3,paVar7->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Section::~Section() {
        if (m_sectionIncluded) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if (uncaught_exceptions())
                getResultCapture().sectionEndedEarly(endInfo);
            else
                getResultCapture().sectionEnded(endInfo);
        }
    }